

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Highs.cpp
# Opt level: O3

HighsStatus __thiscall
Highs::changeColsIntegrality
          (Highs *this,HighsInt num_set_entries,HighsInt *set,HighsVarType *integrality)

{
  function<void_(int,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_HighsCallbackDataOut_*,_HighsCallbackDataIn_*,_void_*)>
  *pfVar1;
  string method;
  HighsInt HVar2;
  HighsStatus HVar3;
  vector<int,_std::allocator<int>_> local_set;
  vector<HighsVarType,_std::allocator<HighsVarType>_> local_integrality;
  HighsIndexCollection index_collection;
  undefined1 in_stack_fffffffffffffe4c [12];
  HighsInt *in_stack_fffffffffffffe58;
  pointer in_stack_fffffffffffffe60;
  HighsVarType *local_190 [3];
  string local_178;
  undefined1 *local_158 [2];
  undefined1 local_148 [16];
  HighsIndexCollection local_138;
  HighsLogOptions local_e8;
  HighsLogOptions local_88;
  
  if (num_set_entries == 0) {
    HVar3 = kOk;
  }
  else {
    this->model_presolve_status_ = kNotPresolved;
    HighsModel::clear(&this->presolved_model_);
    PresolveComponent::clear(&this->presolve_);
    std::vector<HighsVarType,std::allocator<HighsVarType>>::vector<HighsVarType_const*,void>
              ((vector<HighsVarType,std::allocator<HighsVarType>> *)local_190,integrality,
               integrality + num_set_entries,(allocator_type *)&local_138);
    std::vector<int,std::allocator<int>>::vector<int_const*,void>
              ((vector<int,std::allocator<int>> *)&stack0xfffffffffffffe58,set,set + num_set_entries
               ,(allocator_type *)&local_138);
    sortSetData(num_set_entries,(vector<int,_std::allocator<int>_> *)&stack0xfffffffffffffe58,
                integrality,local_190[0]);
    local_138.dimension_ = -1;
    local_138.is_interval_ = false;
    local_138.from_ = -1;
    local_138.to_ = -2;
    local_138.is_set_ = false;
    local_138.set_num_entries_ = -1;
    local_138.mask_.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    local_138.mask_.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    local_138.mask_.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    local_138.set_.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    local_138.set_.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_finish._0_1_ = 0;
    local_138.set_.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_finish._1_7_ = 0;
    local_138.set_.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage._0_1_ = 0;
    local_138._41_8_ = 0;
    HVar2 = create(&local_138,num_set_entries,in_stack_fffffffffffffe58,(this->model_).lp_.num_col_)
    ;
    if (HVar2 == 0) {
      HVar3 = changeIntegralityInterface(this,&local_138,local_190[0]);
      local_e8.log_stream = (this->options_).super_HighsOptionsStruct.log_options.log_stream;
      local_e8.output_flag = (this->options_).super_HighsOptionsStruct.log_options.output_flag;
      local_e8.log_to_console = (this->options_).super_HighsOptionsStruct.log_options.log_to_console
      ;
      local_e8.log_dev_level = (this->options_).super_HighsOptionsStruct.log_options.log_dev_level;
      local_e8.user_log_callback =
           (this->options_).super_HighsOptionsStruct.log_options.user_log_callback;
      local_e8.user_log_callback_data =
           (this->options_).super_HighsOptionsStruct.log_options.user_log_callback_data;
      pfVar1 = &local_e8.user_callback;
      std::
      function<void_(int,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_HighsCallbackDataOut_*,_HighsCallbackDataIn_*,_void_*)>
      ::function(pfVar1,&(this->options_).super_HighsOptionsStruct.log_options.user_callback);
      local_e8.user_callback_active =
           (this->options_).super_HighsOptionsStruct.log_options.user_callback_active;
      local_e8.user_callback_data =
           (this->options_).super_HighsOptionsStruct.log_options.user_callback_data;
      local_178._M_dataplus._M_p = (pointer)&local_178.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_178,"changeIntegrality","");
      HVar3 = interpretCallStatus(&local_e8,HVar3,kOk,&local_178);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_178._M_dataplus._M_p != &local_178.field_2) {
        operator_delete(local_178._M_dataplus._M_p);
      }
      if (local_e8.user_callback.super__Function_base._M_manager != (_Manager_type)0x0) {
        (*local_e8.user_callback.super__Function_base._M_manager)
                  ((_Any_data *)pfVar1,(_Any_data *)pfVar1,__destroy_functor);
      }
      if (HVar3 == kError) {
        HVar3 = kError;
      }
      else {
        HVar3 = returnFromHighs(this,HVar3);
      }
    }
    else {
      local_88.log_stream = (this->options_).super_HighsOptionsStruct.log_options.log_stream;
      local_88.output_flag = (this->options_).super_HighsOptionsStruct.log_options.output_flag;
      local_88.log_to_console = (this->options_).super_HighsOptionsStruct.log_options.log_to_console
      ;
      local_88.log_dev_level = (this->options_).super_HighsOptionsStruct.log_options.log_dev_level;
      local_88.user_log_callback =
           (this->options_).super_HighsOptionsStruct.log_options.user_log_callback;
      local_88.user_log_callback_data =
           (this->options_).super_HighsOptionsStruct.log_options.user_log_callback_data;
      pfVar1 = &local_88.user_callback;
      std::
      function<void_(int,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_HighsCallbackDataOut_*,_HighsCallbackDataIn_*,_void_*)>
      ::function(pfVar1,&(this->options_).super_HighsOptionsStruct.log_options.user_callback);
      local_88.user_callback_active =
           (this->options_).super_HighsOptionsStruct.log_options.user_callback_active;
      local_88.user_callback_data =
           (this->options_).super_HighsOptionsStruct.log_options.user_callback_data;
      local_158[0] = local_148;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_158,"changeColsIntegrality","");
      method._4_12_ = in_stack_fffffffffffffe4c;
      method._M_dataplus._M_p._0_4_ = (this->model_).lp_.num_col_;
      method.field_2._M_allocated_capacity = (size_type)in_stack_fffffffffffffe58;
      method.field_2._8_8_ = in_stack_fffffffffffffe60;
      analyseSetCreateError
                (&local_88,method,(HighsInt)local_158[0],SUB41(HVar2,0),1,
                 (HighsInt *)(ulong)(uint)num_set_entries,(HighsInt)in_stack_fffffffffffffe58);
      if (local_158[0] != local_148) {
        operator_delete(local_158[0]);
      }
      HVar3 = kError;
      if (local_88.user_callback.super__Function_base._M_manager != (_Manager_type)0x0) {
        (*local_88.user_callback.super__Function_base._M_manager)
                  ((_Any_data *)pfVar1,(_Any_data *)pfVar1,__destroy_functor);
      }
    }
    if (local_138.mask_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_138.mask_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    if (local_138.set_.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
        ._M_start != (pointer)0x0) {
      operator_delete(local_138.set_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    if (in_stack_fffffffffffffe58 != (HighsInt *)0x0) {
      operator_delete(in_stack_fffffffffffffe58);
    }
    if (local_190[0] != (HighsVarType *)0x0) {
      operator_delete(local_190[0]);
    }
  }
  return HVar3;
}

Assistant:

HighsStatus Highs::changeColsIntegrality(const HighsInt num_set_entries,
                                         const HighsInt* set,
                                         const HighsVarType* integrality) {
  if (num_set_entries == 0) return HighsStatus::kOk;
  clearPresolve();
  // Ensure that the set and data are in ascending order
  std::vector<HighsVarType> local_integrality{integrality,
                                              integrality + num_set_entries};
  std::vector<HighsInt> local_set{set, set + num_set_entries};
  sortSetData(num_set_entries, local_set, integrality,
              local_integrality.data());
  HighsIndexCollection index_collection;
  const HighsInt create_error = create(index_collection, num_set_entries,
                                       local_set.data(), model_.lp_.num_col_);
  if (create_error)
    return analyseSetCreateError(options_.log_options, "changeColsIntegrality",
                                 create_error, true, num_set_entries,
                                 local_set.data(), model_.lp_.num_col_);
  HighsStatus call_status =
      changeIntegralityInterface(index_collection, local_integrality.data());
  HighsStatus return_status = HighsStatus::kOk;
  return_status = interpretCallStatus(options_.log_options, call_status,
                                      return_status, "changeIntegrality");
  if (return_status == HighsStatus::kError) return HighsStatus::kError;
  return returnFromHighs(return_status);
}